

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::OutOfRange::OutOfRange(OutOfRange *this,OutOfRange *param_1)

{
  OutOfRange *param_1_local;
  OutOfRange *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__OutOfRange_001fd188;
  return;
}

Assistant:

class CAMP_API OutOfRange : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param index Invalid index
     * \param size Allowed size
     */
    OutOfRange(std::size_t index, std::size_t size);
}